

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

void __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseCurrentNode
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  unsigned_short uVar1;
  unsigned_short *start_00;
  bool bVar2;
  unsigned_short *start;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  start_00 = this->P;
  while( true ) {
    bVar2 = false;
    if (*this->P != 0x3c) {
      bVar2 = *this->P != 0;
    }
    if (!bVar2) break;
    this->P = this->P + 1;
  }
  if ((*this->P != 0) &&
     (((long)this->P - (long)start_00 >> 1 < 1 || (bVar2 = setText(this,start_00,this->P), !bVar2)))
     ) {
    this->P = this->P + 1;
    uVar1 = *this->P;
    if (uVar1 == 0x21) {
      bVar2 = parseCDATA(this);
      if (!bVar2) {
        parseComment(this);
      }
    }
    else if (uVar1 == 0x2f) {
      parseClosingXMLElement(this);
    }
    else if (uVar1 == 0x3f) {
      ignoreDefinition(this);
    }
    else {
      parseOpeningXMLElement(this);
    }
  }
  return;
}

Assistant:

void parseCurrentNode()
	{
		char_type* start = P;

		// move forward until '<' found
		while(*P != L'<' && *P)
			++P;

		if (!*P)
			return;

		if (P - start > 0)
		{
			// we found some text, store it
			if (setText(start, P))
				return;
		}

		++P;

		// based on current token, parse and report next element
		switch(*P)
		{
		case L'/':
			parseClosingXMLElement(); 
			break;
		case L'?':
			ignoreDefinition();	
			break;
		case L'!':
			if (!parseCDATA())
				parseComment();	
			break;
		default:
			parseOpeningXMLElement();
			break;
		}
	}